

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

void ssh_add_special(void *vctx,char *text,SessionSpecialCode code,int arg)

{
  long lVar1;
  void *pvVar2;
  undefined8 *puVar3;
  SessionSpecial *spec;
  ssh_add_special_ctx *ctx;
  int arg_local;
  SessionSpecialCode code_local;
  char *text_local;
  void *vctx_local;
  
  pvVar2 = safegrowarray(*vctx,(size_t *)((long)vctx + 0x10),0x10,*(size_t *)((long)vctx + 8),1,
                         false);
  *(void **)vctx = pvVar2;
  lVar1 = *(long *)((long)vctx + 8);
  *(long *)((long)vctx + 8) = lVar1 + 1;
  puVar3 = (undefined8 *)(*vctx + lVar1 * 0x10);
  *puVar3 = text;
  *(SessionSpecialCode *)(puVar3 + 1) = code;
  *(int *)((long)puVar3 + 0xc) = arg;
  return;
}

Assistant:

static void ssh_add_special(void *vctx, const char *text,
                            SessionSpecialCode code, int arg)
{
    struct ssh_add_special_ctx *ctx = (struct ssh_add_special_ctx *)vctx;
    SessionSpecial *spec;

    sgrowarray(ctx->specials, ctx->specials_size, ctx->nspecials);
    spec = &ctx->specials[ctx->nspecials++];
    spec->name = text;
    spec->code = code;
    spec->arg = arg;
}